

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

complex<float>
TPZMatrix<std::complex<float>_>::ReturnNearestValue
          (complex<float> val,TPZVec<std::complex<float>_> *Vec,complex<float> tol)

{
  undefined8 uVar1;
  _ComplexT *p_Var2;
  long lVar3;
  float in_XMM0_Da;
  float fVar4;
  float in_XMM0_Db;
  uint extraout_XMM0_Db;
  float fVar5;
  uint extraout_XMM0_Db_00;
  uint extraout_XMM0_Db_01;
  float in_XMM0_Dc;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  uint extraout_XMM0_Dc_01;
  float in_XMM0_Dd;
  uint extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  uint extraout_XMM0_Dd_01;
  float in_XMM1_Da;
  _ComplexT local_90;
  float local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  _ComplexT local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  local_68 = in_XMM0_Da;
  fStack_64 = in_XMM0_Db;
  fStack_60 = in_XMM0_Dc;
  fStack_5c = in_XMM0_Dd;
  local_48 = in_XMM1_Da;
  local_88 = cabsf(in_XMM0_Da - (float)**(undefined8 **)(val._M_value + 8));
  local_88 = ABS(local_88);
  uStack_84 = extraout_XMM0_Db & 0x7fffffff;
  uStack_80 = extraout_XMM0_Dc & 0x7fffffff;
  uStack_7c = extraout_XMM0_Dd & 0x7fffffff;
  fVar4 = cabsf(local_48);
  if (ABS(fVar4) <= local_88) {
    fVar4 = local_68 - (float)**(undefined8 **)(val._M_value + 8);
    fVar5 = fStack_64 - (float)((ulong)**(undefined8 **)(val._M_value + 8) >> 0x20);
  }
  else {
    fVar4 = 1e+10;
    fVar5 = 0.0;
  }
  local_90 = *(undefined8 *)(val._M_value + 8);
  local_58 = *(undefined8 *)local_90;
  uStack_50 = 0;
  if (1 < *(long *)(val._M_value + 0x10)) {
    lVar3 = 1;
    local_90 = CONCAT44(fVar5,fVar4);
    do {
      uVar1 = *(undefined8 *)(*(long *)(val._M_value + 8) + lVar3 * 8);
      local_38 = local_68 - (float)uVar1;
      fStack_34 = fStack_64 - (float)((ulong)uVar1 >> 0x20);
      fStack_30 = fStack_60 - 0.0;
      fStack_2c = fStack_5c - 0.0;
      local_70 = CONCAT44(fStack_34,local_38);
      local_88 = cabsf(local_38);
      local_88 = ABS(local_88);
      uStack_84 = extraout_XMM0_Db_00 & 0x7fffffff;
      uStack_80 = extraout_XMM0_Dc_00 & 0x7fffffff;
      uStack_7c = extraout_XMM0_Dd_00 & 0x7fffffff;
      fVar4 = cabsf(local_48);
      p_Var2 = &local_90;
      if (ABS(fVar4) <= local_88) {
        local_88 = cabsf(local_38);
        local_88 = ABS(local_88);
        uStack_84 = extraout_XMM0_Db_01 & 0x7fffffff;
        uStack_80 = extraout_XMM0_Dc_01 & 0x7fffffff;
        uStack_7c = extraout_XMM0_Dd_01 & 0x7fffffff;
        fVar4 = cabsf((float)local_90);
        if (local_88 < ABS(fVar4)) {
          local_58 = *(undefined8 *)(*(long *)(val._M_value + 8) + lVar3 * 8);
          uStack_50 = 0;
          p_Var2 = &local_70;
        }
      }
      local_90 = *p_Var2;
      lVar3 = lVar3 + 1;
    } while (lVar3 < *(long *)(val._M_value + 0x10));
  }
  return (complex<float>)local_90;
}

Assistant:

TVar TPZMatrix<TVar>::ReturnNearestValue(TVar val, TPZVec<TVar>& Vec, TVar tol)
{
    TVar exps = val - (TVar)Vec[0];
    TVar diff0 = fabs(exps) >= fabs(tol) ?  (val - (TVar)Vec[0]) : (TVar)1.E10;
    TVar diff1, res = (TVar)Vec[0];
    for(int64_t i = 1; i < Vec.NElements(); i++)
    {
        diff1 = val - (TVar)Vec[i];
        diff0 = ( fabs(diff1) >= fabs(tol) && fabs(diff1) < fabs(diff0) ) ? res = Vec[i],diff1 : diff0;
    }
    return res;
}